

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O3

int anon_unknown.dwarf_1d66d1e::ParseStd(string *level)

{
  int iVar1;
  string *in_RAX;
  int *piVar2;
  long lVar3;
  char *__endptr;
  string *local_28;
  
  local_28 = in_RAX;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol((char *)level,(char **)&local_28,10);
  if (local_28 == level) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    return (int)lVar3;
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

int ParseStd(std::string const& level)
{
  try {
    return std::stoi(level);
  } catch (std::invalid_argument&) {
    // Fall through to use an invalid value.
  }
  return -1;
}